

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O1

void duckdb::ExecuteStructMakeDate<long>(DataChunk *input,ExpressionState *state,Vector *result)

{
  reference vector;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  reference pvVar1;
  type a;
  type b;
  type c;
  
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  this = StructVector::GetEntries(vector);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,0);
  a = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar1);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,1);
  b = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar1);
  pvVar1 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
           ::operator[](this,2);
  c = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(pvVar1);
  TernaryExecutor::
  ExecuteGeneric<long,long,long,duckdb::date_t,duckdb::TernaryLambdaWrapper,duckdb::date_t(*)(long,long,long)>
            (a,b,c,result,input->count,FromDateCast<long>);
  return;
}

Assistant:

static void ExecuteStructMakeDate(DataChunk &input, ExpressionState &state, Vector &result) {
	// this should be guaranteed by the binder
	D_ASSERT(input.ColumnCount() == 1);
	auto &vec = input.data[0];

	auto &children = StructVector::GetEntries(vec);
	D_ASSERT(children.size() == 3);
	auto &yyyy = *children[0];
	auto &mm = *children[1];
	auto &dd = *children[2];

	TernaryExecutor::Execute<T, T, T, date_t>(yyyy, mm, dd, result, input.size(), FromDateCast<T>);
}